

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::drawSectionItems
          (DateTimePickerPrivate *this,int section,QPainter *p,QStyleOption *opt)

{
  Section *pSVar1;
  Type TVar2;
  Section *pSVar3;
  QString *pQVar4;
  int iVar5;
  QColor *c;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  QPalette *this_00;
  int iVar12;
  bool bVar13;
  QRect r;
  QStringList values;
  QString text;
  
  lVar11 = 0;
  uVar8 = 0;
  if (0 < section) {
    uVar8 = (ulong)(uint)section;
  }
  iVar12 = 0;
  for (; uVar8 * 0x30 - lVar11 != 0; lVar11 = lVar11 + 0x30) {
    iVar12 = iVar12 + *(int *)((long)&((this->super_DateTimeParser).sections.d.ptr)->sectionWidth +
                              lVar11);
  }
  iVar5 = this->itemSideMargin;
  this_00 = (QPalette *)(opt + 0x28);
  QPalette::color(this_00,WindowText);
  QPainter::setPen((QColor *)p);
  pSVar3 = (this->super_DateTimeParser).sections.d.ptr;
  pSVar1 = pSVar3 + section;
  iVar10 = pSVar3[section].offset;
  iVar7 = this->itemsMaxCount;
  lVar11 = pSVar3[section].values.d.size;
  if (lVar11 < iVar7) {
    iVar9 = pSVar1->currentIndex;
    iVar6 = iVar9;
  }
  else {
    iVar6 = (uint)(0 < iVar10) + iVar7 / 2;
    iVar9 = pSVar1->currentIndex;
  }
  iVar12 = iVar12 + iVar5 + 3;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  iVar5 = -this->currentItemY;
  while (bVar13 = iVar6 != 0, iVar6 = iVar6 + -1, bVar13) {
    if (iVar9 == 0) {
      iVar9 = (int)lVar11;
    }
    iVar9 = iVar9 + -1;
    iVar5 = iVar5 + this->itemHeight + this->itemTopMargin;
  }
  iVar6 = (iVar7 + 1) - (uint)(iVar10 == 0);
  if (lVar11 < iVar7) {
    iVar6 = (int)lVar11;
  }
  TVar2 = pSVar1->type;
  iVar7 = pSVar1->sectionWidth + iVar12 + this->itemSideMargin * -2 + -7;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  iVar10 = iVar10 - iVar5;
  while (bVar13 = iVar6 != 0, iVar6 = iVar6 + -1, bVar13) {
    r.y2 = iVar10 + -1 + this->itemHeight;
    pQVar4 = (this->super_DateTimeParser).sections.d.ptr[section].values.d.ptr;
    text.d.d = pQVar4[iVar9].d.d;
    text.d.ptr = pQVar4[iVar9].d.ptr;
    text.d.size = pQVar4[iVar9].d.size;
    if (text.d.d != (Data *)0x0) {
      LOCK();
      ((text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    r.x1 = iVar12;
    r.y1 = iVar10;
    r.x2 = iVar7;
    if ((TVar2 == DaySectionLong) || (TVar2 == DaySectionShort)) {
      QString::split(&values,&text.d,0x20,0,1);
      c = QPalette::color(this_00,WindowText);
      lighterColor(c,0x4b);
      QPainter::setPen((QColor *)p);
      QPainter::drawText((QRect *)p,(int)&r,(QString *)0x101,(QRect *)values.d.ptr);
      QPalette::color(this_00,WindowText);
      QPainter::setPen((QColor *)p);
      QPainter::drawText((QRect *)p,(int)&r,(QString *)0x102,(QRect *)(values.d.ptr + 1));
      QArrayDataPointer<QString>::~QArrayDataPointer(&values.d);
    }
    else {
      QPainter::drawText((QRect *)p,(int)&r,(QString *)0x101,(QRect *)&text.d);
    }
    bVar13 = (int)(this->super_DateTimeParser).sections.d.ptr[section].values.d.size + -1 == iVar9;
    iVar9 = iVar9 + 1;
    if (bVar13) {
      iVar9 = 0;
    }
    iVar10 = iVar10 + this->itemHeight + this->itemTopMargin;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&text.d);
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::drawSectionItems( int section, QPainter * p,
	const QStyleOption & opt )
{
	int x = 0;

	for( int i = 0; i < section; ++i )
		x += sections.at( i ).sectionWidth;

	x += 3 + itemSideMargin;

	p->setPen( opt.palette.color( QPalette::WindowText ) );

	const int yOffset = sections.at( section ).offset;

	int makePrevIndexCount = itemsMaxCount / 2;

	if( yOffset > 0 )
		++makePrevIndexCount;

	if( sections.at( section ).values.size() < itemsMaxCount )
		makePrevIndexCount = sections.at( section ).currentIndex;

	int index = sections.at( section ).currentIndex;
	int y = currentItemY + yOffset;

	for( int i = 0; i < makePrevIndexCount; ++i )
	{
		index = prevIndex( index, sections.at( section ).values.size() );
		y -= ( itemHeight + itemTopMargin );
	}

	int iterationsCount = ( yOffset == 0 ) ? itemsMaxCount : itemsMaxCount + 1;

	if( sections.at( section ).values.size() < itemsMaxCount )
		iterationsCount = sections.at( section ).values.size();

	const int textWidth = sections.at( section ).sectionWidth - 6 -
		itemSideMargin * 2;

	Section::Type type = sections.at( section ).type;

	for( int i = 0; i < iterationsCount; ++i )
	{
		const QRect r( x, y, textWidth, itemHeight );

		const QString text = sections.at( section ).values.at( index );

		if( type == Section::DaySectionShort ||
			type == Section::DaySectionLong )
		{
			QStringList values = text.split( QLatin1Char( ' ' ) );

			p->setPen(
				lighterColor( opt.palette.color( QPalette::WindowText ), 75 ) );
			p->drawText( r, Qt::AlignLeft | Qt::TextSingleLine, values.at( 0 ) );

			p->setPen( opt.palette.color( QPalette::WindowText ) );
			p->drawText( r, Qt::AlignRight | Qt::TextSingleLine, values.at( 1 ) );
		}
		else
			p->drawText( r, Qt::AlignLeft | Qt::TextSingleLine, text );

		index = nextIndex( index, sections.at( section ).values.size() );
		y += itemHeight + itemTopMargin;
	}
}